

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O2

List __thiscall xt::list::cons(list *this,List *list,Object *o)

{
  _List *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  List LVar1;
  __shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  Object local_48;
  
  this_00 = (_List *)operator_new(0x38);
  Object::Object(&local_48,o);
  std::__shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_58,&list->super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>);
  _List::_List(this_00,&local_48,(shared_ptr<xt::_List> *)&_Stack_58,
               ((list->super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->count + 1
              );
  std::__shared_ptr<xt::_List,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<xt::_List,void>
            ((__shared_ptr<xt::_List,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
  LVar1.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  LVar1.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (List)LVar1.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

List cons(List list, Object o) {
	return List(new _List {o, list, list->count+1});
}